

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformanceTesting.cpp
# Opt level: O0

void dijkstraPerfTest(Graph<std::pair<double,_double>_> *graph)

{
  anon_class_8_1_a7fab06e local_38;
  function<Path_(int,_int)> local_30;
  Graph<std::pair<double,_double>_> *local_10;
  Graph<std::pair<double,_double>_> *graph_local;
  
  local_38.graph = graph;
  local_10 = graph;
  std::function<Path(int,int)>::
  function<dijkstraPerfTest(Graph<std::pair<double,double>>&)::__0,void>
            ((function<Path(int,int)> *)&local_30,&local_38);
  shortestPathPerfTest(graph,&local_30,'D');
  std::function<Path_(int,_int)>::~function(&local_30);
  return;
}

Assistant:

void dijkstraPerfTest(Graph<coordinates> &graph) {
    shortestPathPerfTest(graph, [&](int s, int d) { return graph.dijkstraShortestPath(s, d); }, 'D');
}